

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O1

void __thiscall Fl_Decl_Type::read_property(Fl_Decl_Type *this,char *c)

{
  int iVar1;
  
  iVar1 = strcmp(c,"public");
  if (iVar1 == 0) {
    this->public_ = '\x01';
  }
  else {
    iVar1 = strcmp(c,"private");
    if (iVar1 == 0) {
      this->public_ = '\0';
    }
    else {
      iVar1 = strcmp(c,"protected");
      if (iVar1 == 0) {
        this->public_ = '\x02';
      }
      else {
        iVar1 = strcmp(c,"local");
        if (iVar1 == 0) {
          this->static_ = '\x01';
        }
        else {
          iVar1 = strcmp(c,"global");
          if (iVar1 != 0) {
            Fl_Type::read_property(&this->super_Fl_Type,c);
            return;
          }
          this->static_ = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Decl_Type::read_property(const char *c) {
  if (!strcmp(c,"public")) {
    public_ = 1;
  } else if (!strcmp(c,"private")) {
    public_ = 0;
  } else if (!strcmp(c,"protected")) {
    public_ = 2;
  } else if (!strcmp(c,"local")) {
    static_ = 1;
  } else if (!strcmp(c,"global")) {
    static_ = 0;
  } else {
    Fl_Type::read_property(c);
  }
}